

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

bool __thiscall crsGA::Logger::addLogHandler(Logger *this,LogHandlerPtr *logHandler,string *id)

{
  mapped_type *this_00;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  string *id_local;
  LogHandlerPtr *logHandler_local;
  Logger *this_local;
  
  lock._M_device = (mutex_type *)id;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->_mutex);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
            ::operator[](&this->_logHandlersMap,(key_type *)lock._M_device);
  std::shared_ptr<crsGA::LogHandler>::operator=(this_00,logHandler);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return true;
}

Assistant:

bool Logger::addLogHandler(Logger::LogHandlerPtr logHandler, const std::string &id)
{
    std::lock_guard<std::mutex> lock(_mutex);

    _logHandlersMap[id] = logHandler;
    return true;
}